

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O0

void bench_compute_response_layer
               (vector<void_(*)(fasthessian_*),_std::allocator<void_(*)(fasthessian_*)>_> *functions
               ,integral_image *iimage,vector<benchmark_data,_std::allocator<benchmark_data>_> *data
               )

{
  fasthessian *__ptr;
  ulong uVar1;
  size_type sVar2;
  vector<benchmark_data,_std::allocator<benchmark_data>_> *in_RDX;
  vector<void_(*)(fasthessian_*),_std::allocator<void_(*)(fasthessian_*)>_> *in_RDI;
  int i;
  int j;
  fasthessian *fh;
  benchmark_data *in_stack_00000050;
  fasthessian *in_stack_00000058;
  _func_void_fasthessian_ptr *in_stack_00000060;
  integral_image *in_stack_ffffffffffffffc0;
  fasthessian *in_stack_ffffffffffffffd0;
  int local_28;
  int local_24;
  
  __ptr = create_fast_hessian(in_stack_ffffffffffffffc0);
  create_response_map(in_stack_ffffffffffffffd0);
  local_24 = 0;
  while( true ) {
    uVar1 = (ulong)local_24;
    sVar2 = std::vector<void_(*)(fasthessian_*),_std::allocator<void_(*)(fasthessian_*)>_>::size
                      (in_RDI);
    if (sVar2 <= uVar1) break;
    std::vector<void_(*)(fasthessian_*),_std::allocator<void_(*)(fasthessian_*)>_>::operator[]
              (in_RDI,(long)local_24);
    std::vector<benchmark_data,_std::allocator<benchmark_data>_>::operator[](in_RDX,(long)local_24);
    perf_compute_response_all_layers(in_stack_00000060,in_stack_00000058,in_stack_00000050);
    local_24 = local_24 + 1;
  }
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    free(__ptr->response_map[local_28]->response);
    free(__ptr->response_map[local_28]->laplacian);
    free(__ptr->response_map[local_28]);
  }
  free(__ptr);
  return;
}

Assistant:

void bench_compute_response_layer(const std::vector<void (*)(struct fasthessian *)> &functions,
                                  struct integral_image *iimage, std::vector<struct benchmark_data> &data) {
    // TODO: (carla) do we need a new fast hessian for every function?
    struct fasthessian *fh = create_fast_hessian(iimage);
    // Create octaves with response layers
    create_response_map(fh);

    assert(functions.size() == data.size());

    for (int j = 0; j < functions.size(); ++j) {
        perf_compute_response_all_layers(functions[j], fh, data[j]);
    }
    for (int i = 0; i < NUM_LAYERS; ++i) {
        free(fh->response_map[i]->response);
        free(fh->response_map[i]->laplacian);
        free(fh->response_map[i]);
    }
    free(fh);
}